

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
try_dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 *item)

{
  bool bVar1;
  size_t sVar2;
  __pointer_type this_00;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> *in_RDI;
  __pointer_type ptr_1;
  size_t size;
  __pointer_type ptr;
  size_t bestSize;
  ProducerBase *best;
  size_t nonEmptyCount;
  ProducerBase *in_stack_ffffffffffffffb8;
  ProducerBase *local_38;
  ulong local_30;
  ProducerBase *local_28;
  ProducerBase *this_01;
  
  this_01 = (ProducerBase *)0x0;
  local_28 = (ProducerBase *)0x0;
  local_30 = 0;
  for (local_38 = std::
                  atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                  ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                          *)in_stack_ffffffffffffffb8,(memory_order)((ulong)in_RDI >> 0x20));
      this_01 < (ProducerBase *)0x3 && local_38 != (ProducerBase *)0x0;
      local_38 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                 ::ProducerBase::next_prod(local_38)) {
    sVar2 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
            ::ProducerBase::size_approx(this_01);
    if (sVar2 != 0) {
      if (local_30 < sVar2) {
        local_28 = local_38;
        local_30 = sVar2;
      }
      this_01 = (ProducerBase *)((long)&this_01->_vptr_ProducerBase + 1);
    }
  }
  if (this_01 != (ProducerBase *)0x0) {
    bVar1 = ProducerBase::
            dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                      (in_stack_ffffffffffffffb8,in_RDI);
    bVar1 = details::likely(bVar1);
    if (bVar1) {
      return true;
    }
    for (this_00 = std::
                   atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                   ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                           *)in_stack_ffffffffffffffb8,(memory_order)((ulong)in_RDI >> 0x20));
        this_00 != (ProducerBase *)0x0;
        this_00 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                  ::ProducerBase::next_prod(this_00)) {
      if ((this_00 != local_28) &&
         (bVar1 = ProducerBase::
                  dequeue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
                            (this_00,in_RDI), bVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool try_dequeue(U& item) {
    // Instead of simply trying each producer in turn (which could cause
    // needless contention on the first producer), we score them heuristically.
    size_t nonEmptyCount = 0;
    ProducerBase* best = nullptr;
    size_t bestSize = 0;
    for (auto ptr = producerListTail.load(std::memory_order_acquire);
         nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
      auto size = ptr->size_approx();
      if (size > 0) {
        if (size > bestSize) {
          bestSize = size;
          best = ptr;
        }
        ++nonEmptyCount;
      }
    }

    // If there was at least one non-empty queue but it appears empty at the
    // time we try to dequeue from it, we need to make sure every queue's been
    // tried
    if (nonEmptyCount > 0) {
      if ((details::likely)(best->dequeue(item))) {
        return true;
      }
      for (auto ptr = producerListTail.load(std::memory_order_acquire);
           ptr != nullptr; ptr = ptr->next_prod()) {
        if (ptr != best && ptr->dequeue(item)) {
          return true;
        }
      }
    }
    return false;
  }